

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O2

void __thiscall
TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test::testBody
          (TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test *this)

{
  ApprovalTestNamer namer;
  string sep;
  SubdirectoryDisposer suppress_subdirectory;
  ApprovalTestNamer local_170;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  SubdirectoryDisposer local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"",(allocator<char> *)&local_128);
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::useApprovalsSubdirectory(&local_28,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  local_170.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_00164818;
  ApprovalTests::SystemUtils::getDirectorySeparator_abi_cxx11_();
  ApprovalTests::ApprovalTestNamer::getDirectory_abi_cxx11_(&local_88,&local_170);
  std::operator+(&local_108,&local_148,"CppUTest_Tests");
  std::operator+(&local_e8,&local_108,&local_148);
  std::operator+(&local_c8,&local_e8,"namers");
  std::operator+(&local_a8,&local_c8,&local_148);
  std::__cxx11::string::string((string *)&local_128,(string *)&local_88);
  ApprovalTests::StringUtils::toLower((string *)&local_168,&local_128);
  std::__cxx11::string::string((string *)&local_68,(string *)&local_a8);
  ApprovalTests::StringUtils::toLower(&local_48,&local_68);
  anon_unknown.dwarf_1344f::checkEndsWith(&local_168,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_148);
  ApprovalTests::SubdirectoryDisposer::~SubdirectoryDisposer(&local_28);
  return;
}

Assistant:

TEST(NamerTestGroup, ItCanGiveYouTheTestDirectory)
{
    // This should work with CaseSensitive::Yes.
    // However, it would fail when run in Visual Studio 2017 as lower-case source-file names are returned.
    // We've fixed this for filenames, but not directory names, so this test ignores case.
    // See https://stackoverflow.com/questions/49068785/how-to-find-the-filename-from-a-c11-stat-objects-file-serial-number-on-window
    auto suppress_subdirectory = Approvals::useApprovalsSubdirectory("");
    ApprovalTestNamer namer;
    auto sep = SystemUtils::getDirectorySeparator();
    checkEndsWithIgnoringCase(namer.getDirectory(),
                              sep + "CppUTest_Tests" + sep + "namers" + sep);
}